

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O1

type __thiscall
boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
          (boost *this,JointPolicyPureVectorForClusteredBG *arg1)

{
  int iVar1;
  undefined4 extraout_var;
  shared_count extraout_RDX;
  type tVar3;
  shared_ptr<JointPolicyPureVectorForClusteredBG> pt;
  shared_count local_30;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)0x0;
  detail::shared_count::
  shared_count<JointPolicyPureVectorForClusteredBG*,boost::detail::sp_ms_deleter<JointPolicyPureVectorForClusteredBG>>
            (&local_30,0);
  if (local_30.pi_ != (sp_counted_base *)0x0) {
    iVar1 = (*(local_30.pi_)->_vptr_sp_counted_base[5])();
    puVar2 = (undefined1 *)CONCAT44(extraout_var,iVar1);
  }
  JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
            ((JointPolicyPureVectorForClusteredBG *)(puVar2 + 8),arg1);
  *puVar2 = 1;
  *(JointPolicyPureVectorForClusteredBG **)this =
       (JointPolicyPureVectorForClusteredBG *)(puVar2 + 8);
  *(sp_counted_base **)(this + 8) = local_30.pi_;
  if (local_30.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_30.pi_)->use_count_ = (local_30.pi_)->use_count_ + 1;
    UNLOCK();
  }
  detail::shared_count::~shared_count(&local_30);
  tVar3.pn.pi_ = extraout_RDX.pi_;
  tVar3.px = (element_type *)this;
  return tVar3;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Arg1 && arg1, Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Arg1>( arg1 ), boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}